

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestRegistryTest.cpp
# Opt level: O2

void __thiscall
TEST_TestRegistry_runTwoTests_Test::TEST_TestRegistry_runTwoTests_Test
          (TEST_TestRegistry_runTwoTests_Test *this)

{
  (this->super_TEST_GROUP_CppUTestGroupTestRegistry).test4 = (MockTest *)0x0;
  (this->super_TEST_GROUP_CppUTestGroupTestRegistry).result = (TestResult *)0x0;
  (this->super_TEST_GROUP_CppUTestGroupTestRegistry).test2 = (MockTest *)0x0;
  (this->super_TEST_GROUP_CppUTestGroupTestRegistry).test3 = (MockTest *)0x0;
  (this->super_TEST_GROUP_CppUTestGroupTestRegistry).output = (StringBufferTestOutput *)0x0;
  (this->super_TEST_GROUP_CppUTestGroupTestRegistry).test1 = (MockTest *)0x0;
  (this->super_TEST_GROUP_CppUTestGroupTestRegistry).super_Utest._vptr_Utest = (_func_int **)0x0;
  (this->super_TEST_GROUP_CppUTestGroupTestRegistry).myRegistry = (TestRegistry *)0x0;
  (this->super_TEST_GROUP_CppUTestGroupTestRegistry).mockResult = (MockTestResult *)0x0;
  TEST_GROUP_CppUTestGroupTestRegistry::TEST_GROUP_CppUTestGroupTestRegistry
            (&this->super_TEST_GROUP_CppUTestGroupTestRegistry);
  (this->super_TEST_GROUP_CppUTestGroupTestRegistry).super_Utest._vptr_Utest =
       (_func_int **)&PTR__Utest_00379d88;
  return;
}

Assistant:

TEST(TestRegistry, runTwoTests)
{
    myRegistry->addTest(test1);
    myRegistry->addTest(test2);
    CHECK(!test1->hasRun_);
    CHECK(!test2->hasRun_);
    myRegistry->runAllTests(*result);
    CHECK(test1->hasRun_);
    CHECK(test2->hasRun_);
}